

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.c
# Opt level: O3

void VerticalFilter_C(uint8_t *data,int width,int height,int stride,uint8_t *filtered_data)

{
  long lVar1;
  uint8_t *preds;
  uint8_t *puVar2;
  int iVar3;
  ulong uVar4;
  
  *filtered_data = *data;
  if (1 < width) {
    uVar4 = 0;
    do {
      filtered_data[uVar4 + 1] = data[uVar4 + 1] - data[uVar4];
      uVar4 = uVar4 + 1;
    } while (width - 1 != uVar4);
  }
  if (1 < height) {
    lVar1 = (long)stride;
    puVar2 = filtered_data + lVar1;
    iVar3 = 1;
    do {
      if (0 < width) {
        uVar4 = 0;
        do {
          puVar2[uVar4] = data[uVar4 + lVar1] - data[uVar4];
          uVar4 = uVar4 + 1;
        } while ((uint)width != uVar4);
      }
      data = data + lVar1;
      iVar3 = iVar3 + 1;
      puVar2 = puVar2 + lVar1;
    } while (iVar3 != height);
  }
  return;
}

Assistant:

static WEBP_INLINE void DoVerticalFilter_C(const uint8_t* in,
                                           int width, int height, int stride,
                                           int row, int num_rows,
                                           int inverse, uint8_t* out) {
  const uint8_t* preds;
  const size_t start_offset = row * stride;
  const int last_row = row + num_rows;
  SANITY_CHECK(in, out);
  in += start_offset;
  out += start_offset;
  preds = inverse ? out : in;

  if (row == 0) {
    // Very first top-left pixel is copied.
    out[0] = in[0];
    // Rest of top scan-line is left-predicted.
    PredictLine_C(in + 1, preds, out + 1, width - 1, inverse);
    row = 1;
    in += stride;
    out += stride;
  } else {
    // We are starting from in-between. Make sure 'preds' points to prev row.
    preds -= stride;
  }

  // Filter line-by-line.
  while (row < last_row) {
    PredictLine_C(in, preds, out, width, inverse);
    ++row;
    preds += stride;
    in += stride;
    out += stride;
  }
}